

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

int NULLC::IsCoroutineReset(NULLCRef f)

{
  uint uVar1;
  char *pcVar2;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (*(uint *)(linker + 0x20c) <= in_stack_00000008) {
    pcVar2 = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
LAB_0011d4ed:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,pcVar2);
  }
  if (*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)in_stack_00000008 * 0x50) == 3) {
    uVar1 = *(uint *)((undefined8 *)CONCAT44(f.typeID,in_stack_0000000c) + 1);
    if (*(uint *)(linker + 0x24c) <= uVar1) {
      pcVar2 = 
      "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_0011d4ed;
    }
    if (*(char *)(*(long *)(linker + 0x240) + 0x35 + (ulong)uVar1 * 0x94) == '\x03') {
      return (uint)(**(int **)CONCAT44(f.typeID,in_stack_0000000c) == 0);
    }
    pcVar2 = "Function is not a coroutine";
  }
  else {
    pcVar2 = "Argument is not a function";
  }
  nullcThrowError(pcVar2);
  return 0;
}

Assistant:

int NULLC::IsCoroutineReset(NULLCRef f)
{
	if(linker->exTypes[f.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
	{
		nullcThrowError("Argument is not a function");
		return 0;
	}
	NULLCFuncPtr *fPtr = (NULLCFuncPtr*)f.ptr;
	if(linker->exFunctions[fPtr->id].funcCat != ExternFuncInfo::COROUTINE)
	{
		nullcThrowError("Function is not a coroutine");
		return 0;
	}

	unsigned jmpOffset = *(unsigned*)fPtr->context;
	return jmpOffset == 0;
}